

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O2

string * cpp_client::anon_unknown_7::handle_itr
                   (string *__return_storage_ptr__,Base_game *context,Delta_mergable *apply_to,
                   ConstMemberIterator *itr,Delta_mergable *owner,
                   vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *refs,vec_ref_t *vec_refs,string *owner_name)

{
  tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_> this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *val
  ;
  uint uVar1;
  Pointer this_00;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var2;
  long *plVar3;
  Delta_mergable *pDVar4;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> uVar5;
  pointer ppVar6;
  bool bVar7;
  int iVar8;
  Ch *pCVar9;
  undefined4 extraout_var;
  ConstMemberIterator CVar10;
  ConstMemberIterator CVar11;
  ConstMemberIterator CVar12;
  ConstMemberIterator CVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar14;
  ostream *poVar15;
  mapped_type *pmVar16;
  __shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2> *this_02;
  mapped_type *pmVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bad_response *this_03;
  Value *doc;
  Value *doc_00;
  Value *val_00;
  type_info *ptVar18;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_04;
  shared_ptr<cpp_client::Base_object> sVar19;
  __uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_> local_120;
  Base_game *local_118;
  Delta_mergable *local_110;
  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
  *local_108;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> value;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  to_edit;
  int num;
  undefined4 uStack_cc;
  string str;
  Delta_mergable *owner_local;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  temp_refs;
  string name;
  shared_ptr<cpp_client::Base_object> ptr;
  mapped_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_40;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_38;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  
  this_00 = itr->ptr_;
  local_108 = (vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
               *)refs;
  owner_local = owner;
  pCVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(&this_00->name);
  std::__cxx11::string::string((string *)&name,pCVar9,(allocator *)&str);
  local_118 = context;
  iVar8 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])(context);
  this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)CONCAT44(extraout_var,iVar8);
  uVar1 = (this_00->value).flags_;
  if (uVar1 == 0) {
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)apply_to->variables_,&name);
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length = 0;
    _Var2._M_head_impl =
         (pmVar16->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (holder *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_holder[5])(_Var2._M_head_impl,&str);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&str);
  }
  else {
    this_04 = &this_00->value;
    if (uVar1 == 3) {
      CVar10 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::FindMember(this_04,(local_118->len_string_)._M_dataplus._M_p);
      CVar11 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::FindMember(this_04,"gameObjectName");
      CVar12 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::FindMember(this_04,"id");
      CVar13 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(this_04);
      local_110 = apply_to;
      if (CVar10.ptr_ == CVar13.ptr_) {
        CVar10 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(this_04);
        if (CVar11.ptr_ == CVar10.ptr_) {
          CVar10 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(this_04);
          if (CVar12.ptr_ != CVar10.ptr_) {
            attr_wrapper::as<std::__cxx11::string>
                      (__return_storage_ptr__,(attr_wrapper *)&(CVar12.ptr_)->value,doc_00);
            if (owner_name->_M_string_length == 0) {
              str._M_dataplus._M_p = (pointer)apply_to;
              to_edit.
              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)apply_to->variables_,&name);
              std::
              vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string_const&>
                        (local_108,(Delta_mergable **)&str,(Any **)&to_edit,&name,
                         __return_storage_ptr__);
            }
            goto LAB_0012707d;
          }
          CVar10 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberBegin(this_04);
          while( true ) {
            ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)CVar10.ptr_;
            CVar11 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_04);
            if (CVar10.ptr_ == CVar11.ptr_) break;
            pCVar9 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(&(CVar10.ptr_)->name);
            std::__cxx11::string::string((string *)&str,pCVar9,(allocator *)&to_edit);
            val = &(CVar10.ptr_)->value;
            if (((CVar10.ptr_)->value).flags_ == 3) {
              CVar11 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::FindMember(val,"gameObjectName");
              CVar12 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::MemberEnd(val);
              if (CVar11.ptr_ == CVar12.ptr_) {
                iVar8 = (*local_110->_vptr_Delta_mergable[4])(local_110,&name);
                pDVar4 = owner_local;
                if ((char)iVar8 == '\0') {
                  local_120._M_t.
                  super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                  .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                       (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                        )(_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                          )0x0;
                  std::__cxx11::string::string((string *)&to_edit,(string *)&name);
                  Any::Any<std::__cxx11::string>
                            ((Any *)&num,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_edit);
                  std::__cxx11::string::~string((string *)&to_edit);
                  (*pDVar4->_vptr_Delta_mergable[3])
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_edit,pDVar4,owner_name,(Any *)&num,&local_120);
                  Any::get((Any *)&temp_refs);
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  ~unique_ptr((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
                              &to_edit);
                  handle_itr((string *)&to_edit,local_118,
                             (Delta_mergable *)
                             temp_refs.
                             super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(ConstMemberIterator *)&ptr,
                             pDVar4,(vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_108,vec_refs,owner_name);
                  if (to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    iVar8 = (*(local_118->super_Delta_mergable)._vptr_Delta_mergable[8])();
                    pmVar17 = std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)CONCAT44(extraout_var_00,iVar8),&name);
                    value._M_t.
                    super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                    .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl =
                         (__uniq_ptr_data<cpp_client::Any,_std::default_delete<cpp_client::Any>,_true,_true>
                          )(pmVar17->
                           super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                    iVar8 = (*(local_118->super_Delta_mergable)._vptr_Delta_mergable[8])();
                    pmVar17 = std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)CONCAT44(extraout_var_01,iVar8),&name);
                    local_50 = std::__detail::
                               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                             *)(((pmVar17->
                                                 super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->super_Delta_mergable).variables_,&str);
                    std::
                    vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                    ::
                    emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string&>
                              (local_108,(Base_object **)&value,&local_50,&str,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &to_edit);
                  }
                  std::__cxx11::string::~string((string *)&to_edit);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &temp_refs.
                              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                }
                else {
                  std::__cxx11::string::string((string *)&to_edit,(string *)&str);
                  Any::Any<std::__cxx11::string>
                            ((Any *)&local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_edit);
                  std::__cxx11::string::~string((string *)&to_edit);
                  _num = (holder *)0x0;
                  (*local_110->_vptr_Delta_mergable[3])
                            (&value,local_110,&name,&local_120,(Any *)&num);
                  plVar3 = *(long **)value._M_t.
                                     super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                     .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
                  ptVar18 = (type_info *)&void::typeinfo;
                  if (plVar3 != (long *)0x0) {
                    ptVar18 = (type_info *)(**(code **)(*plVar3 + 0x10))(plVar3);
                  }
                  bVar7 = std::type_info::operator==
                                    (ptVar18,(type_info *)
                                             &std::shared_ptr<cpp_client::Base_object>::typeinfo);
                  if (bVar7) {
                    Any::get((Any *)&to_edit);
                    ppVar6 = to_edit.
                             super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &to_edit.
                                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                    uVar5 = value;
                    if (ppVar6 == (pointer)0x0) {
                      sVar19 = std::make_shared<cpp_client::Base_object>();
                      plVar3 = *(long **)uVar5._M_t.
                                         super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                         .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                         _M_head_impl;
                      if (plVar3 != (long *)0x0) {
                        (**(code **)(*plVar3 + 0x28))
                                  (plVar3,&to_edit,
                                   sVar19.
                                   super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._M_pi);
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                 &to_edit.
                                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    Any::get((Any *)&temp_refs);
                    pDVar4 = local_110;
                    handle_itr((string *)&to_edit,local_118,
                               (Delta_mergable *)
                               temp_refs.
                               super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,(ConstMemberIterator *)&ptr
                               ,local_110,
                               (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_108,vec_refs,&name);
                    (*pDVar4->_vptr_Delta_mergable[3])
                              (&local_38,pDVar4,&name,&local_120,(Any *)&num);
                    std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                    ~unique_ptr(&local_38);
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      local_50 = std::__detail::
                                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                               *)local_110->variables_,&name);
                      std::
                      vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                      ::
                      emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                                (local_108,&owner_local,&local_50,&str,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&to_edit);
                    }
                    std::__cxx11::string::~string((string *)&to_edit);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &temp_refs.
                                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  else {
                    morph_any((Any *)value._M_t.
                                     super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                     .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl,
                              val);
                    (*local_110->_vptr_Delta_mergable[3])
                              (&local_40,local_110,&name,&local_120,
                               value._M_t.
                               super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                               .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl);
                    std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                    ~unique_ptr(&local_40);
                  }
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  ~unique_ptr(&value);
                }
                if (_num != (holder *)0x0) {
                  (*_num->_vptr_holder[1])();
                }
                if (local_120._M_t.
                    super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                    .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl !=
                    (_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                     )0x0) {
                  (**(code **)(*(long *)local_120._M_t.
                                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                        _M_head_impl + 8))();
                }
              }
              else {
                handle_itr((string *)&to_edit,local_118,local_110,(ConstMemberIterator *)&ptr,
                           owner_local,
                           (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_108,vec_refs,owner_name);
                if (to_edit.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                  temp_refs.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)owner_local->variables_,&name);
                  std::
                  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                  ::
                  emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                            (local_108,&owner_local,(Any **)&temp_refs,&str,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_edit);
                }
                std::__cxx11::string::~string((string *)&to_edit);
              }
            }
            else {
              pmVar16 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_110->variables_,&str);
              morph_any(pmVar16,val);
            }
            std::__cxx11::string::~string((string *)&str);
            CVar10.ptr_ = CVar10.ptr_ + 1;
          }
        }
        else {
          attr_wrapper::as<std::__cxx11::string>(&str,(attr_wrapper *)&(CVar11.ptr_)->value,doc);
          (*(local_118->super_Delta_mergable)._vptr_Delta_mergable[9])(&to_edit,local_118,&str);
          this_02 = &std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](this_01,&name)->
                     super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_02,(__shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2> *)
                             &to_edit);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::__cxx11::string::~string((string *)&str);
          CVar10 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberBegin(this_04);
          while( true ) {
            temp_refs.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)CVar10.ptr_;
            CVar11 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_04);
            if (CVar10.ptr_ == CVar11.ptr_) break;
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](this_01,&name);
            handle_itr(&str,local_118,
                       &((pmVar17->
                         super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_Delta_mergable,(ConstMemberIterator *)&temp_refs,local_110,
                       (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_108,vec_refs,&name);
            if (str._M_string_length != 0) {
              pCVar9 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString(&(CVar10.ptr_)->name);
              std::__cxx11::string::string((string *)&to_edit,pCVar9,(allocator *)&ptr);
              pmVar17 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](this_01,&name);
              ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pmVar17->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
              pmVar17 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](this_01,&name);
              local_120._M_t.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                   (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                   std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)(((pmVar17->
                                     super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_Delta_mergable).variables_,
                                (key_type *)&to_edit);
              std::
              vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string&,std::__cxx11::string&>
                        (local_108,(Base_object **)&ptr,(Any **)&local_120,(key_type *)&to_edit,&str
                        );
              std::__cxx11::string::~string((string *)&to_edit);
            }
            std::__cxx11::string::~string((string *)&str);
            CVar10.ptr_ = CVar10.ptr_ + 1;
          }
        }
      }
      else {
        iVar8 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(&(CVar10.ptr_)->value);
        (**apply_to->_vptr_Delta_mergable)(apply_to,&name,(long)iVar8);
        to_edit.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        to_edit.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        to_edit.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        temp_refs.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        temp_refs.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        temp_refs.
        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CVar11 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberBegin(this_04);
        local_48 = &local_118->remove_string_;
        val_00 = &(CVar11.ptr_)->value;
        while( true ) {
          this.
          super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
          .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                )(val_00 + -1);
          local_120._M_t.
          super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
          .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
               (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
               (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
               this.
               super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
          CVar11 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(this_04);
          pDVar4 = local_110;
          if (this.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl ==
              (_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               )CVar11.ptr_) break;
          if (this.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               )CVar10.ptr_) {
            if (val_00->flags_ == 3) {
              std::make_shared<cpp_client::Base_object>();
              handle_itr(&str,local_118,
                         &(ptr.
                           super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_Delta_mergable,(ConstMemberIterator *)&local_120,local_110,
                         (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_108,vec_refs,&name);
              pCVar9 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)this.
                                      super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                      .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                      _M_head_impl);
              iVar8 = atoi(pCVar9);
              num = iVar8;
              if (str._M_string_length == 0) {
                std::
                vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                ::emplace_back<int_const&,std::shared_ptr<cpp_client::Base_object>>
                          ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                            *)&to_edit,&num,&ptr);
              }
              else {
                std::
                vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                ::emplace_back<int_const&,std::__cxx11::string>
                          ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                            *)&temp_refs,&num,&str);
              }
              std::__cxx11::string::~string((string *)&str);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptr.
                          super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              str._M_dataplus._M_p = (pointer)0x0;
              morph_any((Any *)&str,val_00);
              ptVar18 = (type_info *)&void::typeinfo;
              if (str._M_dataplus._M_p != (pointer)0x0) {
                ptVar18 = (type_info *)
                          (**(code **)(*(long *)str._M_dataplus._M_p + 0x10))(str._M_dataplus._M_p);
              }
              bVar7 = std::type_info::operator==
                                (ptVar18,(type_info *)&std::__cxx11::string::typeinfo);
              if (bVar7) {
                __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)str._M_dataplus._M_p + 0x18))();
                bVar7 = std::operator!=(__lhs,local_48);
                if (bVar7) goto LAB_00126e9c;
              }
              else {
LAB_00126e9c:
                pCVar9 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)this.
                                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                        _M_head_impl);
                iVar8 = atoi(pCVar9);
                ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     CONCAT44(ptr.
                              super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,iVar8);
                std::
                vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                ::emplace_back<int,cpp_client::Any>
                          ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                            *)&to_edit,(int *)&ptr,(Any *)&str);
              }
              if (str._M_dataplus._M_p != (pointer)0x0) {
                (**(code **)(*(long *)str._M_dataplus._M_p + 8))();
              }
            }
          }
          val_00 = val_00 + 2;
        }
        (*local_110->_vptr_Delta_mergable[1])(local_110,&name,&to_edit);
        if (temp_refs.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            temp_refs.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          str._M_dataplus._M_p = (pointer)pDVar4;
          std::
          vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
          ::
          emplace_back<cpp_client::Base_object*,std::__cxx11::string_const&,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>
                    ((vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                      *)vec_refs,(Base_object **)&str,&name,&temp_refs);
        }
        std::
        vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ::~vector(&temp_refs);
        std::
        vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
        ::~vector(&to_edit);
      }
    }
    else {
      if (uVar1 == 4) {
        this_03 = (Bad_response *)__cxa_allocate_exception(0x10);
        Bad_response::runtime_error(this_03,"Received a JSON array in a delta.");
        __cxa_throw(this_03,&Bad_response::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((uVar1 >> 0x14 & 1) != 0) {
        pCVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_04);
        bVar7 = std::operator==(pCVar9,&local_118->remove_string_);
        if (bVar7) {
          Delta_mergable::erase(owner_local,&name);
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&str);
          goto LAB_0012707d;
        }
      }
      sVar14 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::count(&apply_to->variables_->_M_h,&name);
      if (sVar14 == 0) {
        bVar7 = std::operator!=(&name,"name");
        if (bVar7) {
          poVar15 = ::operator<<((ostream *)&std::cout,text_yellow);
          poVar15 = std::operator<<(poVar15,"Warning: Unknown variable ");
          poVar15 = std::operator<<(poVar15,(string *)&name);
          poVar15 = std::operator<<(poVar15," added.");
          poVar15 = ::operator<<(poVar15,normal);
          std::operator<<(poVar15,"\n");
        }
      }
      pmVar16 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)apply_to->variables_,&name);
      morph_any(pmVar16,this_04);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&str);
  }
LAB_0012707d:
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
   handle_itr(Base_game& context,
              Delta_mergable& apply_to,
              const rapidjson::Value::ConstMemberIterator& itr,
              Delta_mergable* owner,
              std::vector<std::tuple<Delta_mergable*, Any*, std::string, std::string>>& refs,
              vec_ref_t& vec_refs,
              const std::string& owner_name)
{
   const auto& val = itr->value;
   const auto name = std::string(itr->name.GetString());
   auto& objects = context.get_objects();
   //check if it's an object
   if(val.IsObject())
   {
      //check if it's an "array"
      auto len_itr = val.FindMember(context.len_string().c_str());
      auto type_itr = val.FindMember("gameObjectName");
      auto id_itr = val.FindMember("id");
      if(len_itr != val.MemberEnd())
      {
         //array...
         //grab the length
         auto size = attr_wrapper::as<int>(len_itr->value);
         //resize the vector
         apply_to.resize(name, size);
         std::vector<std::pair<std::size_t, Any>> to_edit;
         std::vector<std::pair<std::size_t, Any>> temp_refs;
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            //skip the length iterator
            if(data_iter == len_itr)
            {
               continue;
            }
            //either a game object or a primitive - if it's an object it's a game object
            if(data_iter->value.IsObject())
            {
               //make a base object and then edit it
               auto ptr = std::make_shared<Base_object>();
               auto str = handle_itr(context,
                                     *ptr,
                                     data_iter,
                                     &apply_to,
                                     refs,
                                     vec_refs,
                                     name);
               const auto num = atoi(data_iter->name.GetString());
               if(!str.empty())
               {
                  temp_refs.emplace_back(num, std::move(str));
               }
               else
               {
                  to_edit.emplace_back(num, std::move(ptr));
               }
            }
            else
            {
               Any to_add;
               morph_any(to_add, data_iter->value);
               bool add = true;
               //if it's the remove state remove ignore it
               if(to_add.type() == typeid(std::string))
               {
                  add = (to_add.as<std::string>() != context.remove_string());
               }
               if(add)
               {
                  to_edit.emplace_back(atoi(data_iter->name.GetString()),
                                       std::move(to_add));
               }
            }
         }
         apply_to.change_vec_values(name, to_edit);
         //put vector object references in there too (if non-empty)
         if(!temp_refs.empty())
         {
            vec_refs.emplace_back(static_cast<Base_object*>(&apply_to),
                                  name,
                                  std::move(temp_refs));
         }
      }
      else if(type_itr != val.MemberEnd())
      {
         //new object...
         //give it a place in the objects
         objects[name] = context.generate_object(attr_wrapper::as<std::string>(type_itr->value));
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            auto str = handle_itr(context,
                                  *objects[name],
                                  data_iter,
                                  &apply_to,
                                  refs,
                                  vec_refs,
                                  name);
            if(!str.empty())
            {
               auto target = std::string{data_iter->name.GetString()};
               refs.emplace_back(objects[name].get(),
                                 &objects[name]->variables_[target],
                                 target,
                                 str);
            }
         }
      }
      else if(id_itr != val.MemberEnd())
      {
         const auto ref = attr_wrapper::as<std::string>(id_itr->value);
         if(owner_name.empty())
         {
            //object reference...
            refs.emplace_back(&apply_to,
                              &apply_to.variables_[name],
                              name,
                              ref);
         }
         return ref;
      }
      else
      {
         //map...
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            const auto target = std::string{data_iter->name.GetString()};
            if(data_iter->value.IsObject())
            {
               //see if it is a new object
               const auto name_iter = data_iter->value.FindMember("gameObjectName");
               if(name_iter != data_iter->value.MemberEnd())
               {
                  auto str = handle_itr(context,
                                        apply_to,
                                        data_iter,
                                        owner,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     refs.emplace_back(owner,
                                       &owner->variables_[name],
                                       target,
                                       std::move(str));
                  }
               }
               else if(!apply_to.is_map(name))
               {
                  auto owner2 = static_cast<Base_object*>(owner);
                  Any dummy;
                  Any key = std::string{name};
                  auto self = owner2->add_key_value(owner_name, key, dummy)->get();
                  auto str = handle_itr(context,
                                        *self,
                                        data_iter,
                                        owner2,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     // str is the id of the object to bind to
                     // target is the field name
                     // name is the id of the object to manipulate
                     refs.emplace_back(context.get_objects()[name].get(),
                                       &context.get_objects()[name]->variables_[target],
                                       target,
                                       str);
                  }
               }
               else
               {
                  //need to handle object references
                  Any key{std::string{target}};
                  Any dummy{};
                  auto value = apply_to.add_key_value(name, key, dummy);
                  if(value->type() == typeid(std::shared_ptr<Base_object>))
                  {
                     //make an object if needed
                     if(!value->get())
                     {
                        value->reset(std::make_shared<Base_object>());
                     }
                     auto self = value->get();
                     auto str = handle_itr(context,
                                           *self,
                                           data_iter,
                                           &apply_to,
                                           refs,
                                           vec_refs,
                                           name);
                     apply_to.add_key_value(name, key, dummy);
                     if(!str.empty())
                     {
                        refs.emplace_back(owner,
                                          &apply_to.variables_[name],
                                          target,
                                          std::move(str));
                     }
                  }
                  else
                  {
                     //otherwise just morph it
                     morph_any(*value, data_iter->value);
                     apply_to.add_key_value(name, key, *value);
                  }
               }
            }
            else
            {
               morph_any(apply_to.variables_[target], data_iter->value);
            }
         }
      }
   }
   else if(!val.IsArray())
   {
      if(val.IsNull())
      {
         apply_to.variables_[name].reset();
         return "";
      }
      else if(val.IsString() && val.GetString() == context.remove_string())
      {
         //remove this thing
         owner->erase(name);
         return "";
      }
      //do some checking (ignore name because of game weirdness)
      if(!apply_to.variables_.count(name) && name != "name")
      {
         std::cout << sgr::text_yellow
                   << "Warning: Unknown variable " << name << " added." << sgr::reset
                   << "\n"
                   ;
      }
      morph_any(apply_to.variables_[name], val);
   }
   else
   {
      //array - some kind of error
      throw Bad_response("Received a JSON array in a delta.");
   }
   return "";
}